

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

IssuePtr __thiscall libcellml::Logger::issue(Logger *this,size_t index)

{
  undefined8 *puVar1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  IssuePtr IVar3;
  
  this->_vptr_Logger = (_func_int **)0x0;
  this->mPimpl = (LoggerImpl *)0x0;
  lVar2 = *(long *)(*(long *)(index + 8) + 0x48);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(*(long *)(index + 8) + 0x50) - lVar2 >> 4)) {
    puVar1 = (undefined8 *)(lVar2 + (long)in_RDX._M_pi * 0x10);
    this->_vptr_Logger = (_func_int **)*puVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->mPimpl,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
    in_RDX._M_pi = extraout_RDX;
  }
  IVar3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Logger::issue(size_t index) const
{
    IssuePtr issue = nullptr;
    if (index < pFunc()->mIssues.size()) {
        issue = pFunc()->mIssues.at(index);
    }
    return issue;
}